

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTestScorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fFfNdOnly;
  int fFlopOnly;
  int fNewAlgo;
  int nStepsMax;
  int nConfMax;
  int c;
  Abc_Ntk_t *pNtkRes;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fNewAlgo = 100;
  fFlopOnly = -1;
  fFfNdOnly = 0;
  fVerbose = 0;
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_00289d04:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CSnfsvh");
    if (iVar1 == -1) {
      if (argc == globalUtilOptind + 2) {
        if ((fVerbose == 0) || (local_48 == 0)) {
          pNtk = Abc_NtkTestScorr(argv[globalUtilOptind],argv[globalUtilOptind + 1],fFlopOnly,
                                  fNewAlgo,fFfNdOnly,fVerbose,local_48,local_4c);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"Sequential sweeping has failed.\n");
            return 1;
          }
          Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
          return 0;
        }
        Abc_Print(-1,"These two options (-f and -s) are incompatible.\n");
      }
      else {
        Abc_Print(-1,"Expecting two files names on the command line.\n");
      }
      goto LAB_00289f26;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00289f26;
      }
      fNewAlgo = atoi(argv[globalUtilOptind]);
      iVar1 = fNewAlgo;
      break;
    default:
      goto LAB_00289f26;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00289f26;
      }
      fFlopOnly = atoi(argv[globalUtilOptind]);
      iVar1 = fFlopOnly;
      break;
    case 0x66:
      fVerbose = fVerbose ^ 1;
      goto LAB_00289d04;
    case 0x6e:
      fFfNdOnly = fFfNdOnly ^ 1;
      goto LAB_00289d04;
    case 0x73:
      local_48 = local_48 ^ 1;
      goto LAB_00289d04;
    case 0x76:
      local_4c = local_4c ^ 1;
      goto LAB_00289d04;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00289f26:
      Abc_Print(-2,"usage: testscorr [-CS num] [-nfsvh] <file_in> <file_out>\n");
      Abc_Print(-2,"\t             outputs the list of sequential equivalences into a file\n");
      Abc_Print(-2,
                "\t             (if <file_in> is in BENCH, init state file should be the same directory)\n"
               );
      Abc_Print(-2,"\t-C num     : limit on the number of conflicts [default = %d]\n",
                (ulong)(uint)fNewAlgo);
      Abc_Print(-2,
                "\t-S num     : limit on refinement iterations (-1=no limit, 0=after BMC, etc) [default = %d]\n"
                ,(ulong)(uint)fFlopOnly);
      pcVar2 = "scorr";
      if (fFfNdOnly != 0) {
        pcVar2 = "&scorr";
      }
      Abc_Print(-2,"\t-n         : toggle between \"scorr\" and \"&scorr\" [default = %s]\n",pcVar2)
      ;
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-f         : toggle reporting only flop/flop equivs [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_48 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-s         : toggle reporting only flop/flop and flop/node equivs [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (local_4c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v         : toggle verbose output [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h         : print the command usage\n");
      Abc_Print(-2,"\t<file_in>  : input file with design for sequential equivalence computation\n")
      ;
      Abc_Print(-2,"\t<file_out> : output file with the list of pairs of equivalent signals\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTestScorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkTestScorr( char * pFileNameIn, char * pFileNameOut, int nStepsMax, int nBTLimit, int fNewAlgo, int fFlopOnly, int fFfNdOnly, int fVerbose );

    Abc_Ntk_t * pNtkRes;
    int c;
    int nConfMax;
    int nStepsMax;
    int fNewAlgo;
    int fFlopOnly;
    int fFfNdOnly;
    int fVerbose;
    // set defaults
    nConfMax  = 100;
    nStepsMax =  -1;
    fNewAlgo  =   0;
    fFlopOnly =   0;
    fFfNdOnly =   0;
    fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CSnfsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStepsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStepsMax < 0 )
                goto usage;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 'f':
            fFlopOnly ^= 1;
            break;
        case 's':
            fFfNdOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Expecting two files names on the command line.\n" );
        goto usage;
    }
    if ( fFlopOnly && fFfNdOnly )
    {
        Abc_Print( -1, "These two options (-f and -s) are incompatible.\n" );
        goto usage;
    }
    // get the new network
    pNtkRes = Abc_NtkTestScorr( argv[globalUtilOptind], argv[globalUtilOptind+1], nStepsMax, nConfMax, fNewAlgo, fFlopOnly, fFfNdOnly, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: testscorr [-CS num] [-nfsvh] <file_in> <file_out>\n" );
    Abc_Print( -2, "\t             outputs the list of sequential equivalences into a file\n" );
    Abc_Print( -2, "\t             (if <file_in> is in BENCH, init state file should be the same directory)\n" );
    Abc_Print( -2, "\t-C num     : limit on the number of conflicts [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-S num     : limit on refinement iterations (-1=no limit, 0=after BMC, etc) [default = %d]\n", nStepsMax );
    Abc_Print( -2, "\t-n         : toggle between \"scorr\" and \"&scorr\" [default = %s]\n", fNewAlgo? "&scorr": "scorr" );
    Abc_Print( -2, "\t-f         : toggle reporting only flop/flop equivs [default = %s]\n", fFlopOnly? "yes": "no" );
    Abc_Print( -2, "\t-s         : toggle reporting only flop/flop and flop/node equivs [default = %s]\n", fFfNdOnly? "yes": "no" );
    Abc_Print( -2, "\t-v         : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file_in>  : input file with design for sequential equivalence computation\n");
    Abc_Print( -2, "\t<file_out> : output file with the list of pairs of equivalent signals\n");
    return 1;
}